

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.cxx
# Opt level: O0

void __thiscall Fl_Adjuster::draw(Fl_Adjuster *this)

{
  int iVar1;
  int iVar2;
  Fl_Color FVar3;
  Fl_Adjuster *pFVar4;
  Fl_Boxtype local_64;
  Fl_Boxtype local_4c;
  Fl_Boxtype local_34;
  int local_20;
  int local_1c;
  int H;
  int W;
  int dy;
  int dx;
  Fl_Adjuster *this_local;
  
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  if (iVar1 < iVar2) {
    W = 0;
    local_1c = Fl_Widget::w((Fl_Widget *)this);
    local_20 = Fl_Widget::h((Fl_Widget *)this);
    local_20 = local_20 / 3;
    H = local_20;
  }
  else {
    local_1c = Fl_Widget::w((Fl_Widget *)this);
    local_1c = local_1c / 3;
    H = 0;
    local_20 = Fl_Widget::h((Fl_Widget *)this);
    W = local_1c;
  }
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 1) {
    local_34 = FL_DOWN_BOX;
  }
  else {
    local_34 = Fl_Widget::box((Fl_Widget *)this);
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,local_34,iVar1,iVar2 + H * 2,local_1c,local_20,FVar3);
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 2) {
    local_4c = FL_DOWN_BOX;
  }
  else {
    local_4c = Fl_Widget::box((Fl_Widget *)this);
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,local_4c,iVar1 + W,iVar2 + H,local_1c,local_20,FVar3);
  if (*(int *)&(this->super_Fl_Valuator).field_0xa4 == 3) {
    local_64 = FL_DOWN_BOX;
  }
  else {
    local_64 = Fl_Widget::box((Fl_Widget *)this);
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,local_64,iVar1 + W * 2,iVar2,local_1c,local_20,FVar3);
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar1 == 0) {
    FVar3 = Fl_Widget::selection_color((Fl_Widget *)this);
    FVar3 = fl_inactive(FVar3);
    fl_color(FVar3);
  }
  else {
    FVar3 = Fl_Widget::selection_color((Fl_Widget *)this);
    fl_color(FVar3);
  }
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  Fl_Bitmap::draw(&fastarrow,iVar1 + (local_1c + -0x10) / 2,iVar2 + H * 2 + (local_20 + -0x10) / 2,
                  local_1c,local_20,0,0);
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  Fl_Bitmap::draw(&mediumarrow,iVar1 + W + (local_1c + -0x10) / 2,iVar2 + H + (local_20 + -0x10) / 2
                  ,local_1c,local_20,0,0);
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  Fl_Bitmap::draw(&slowarrow,iVar1 + W * 2 + (local_1c + -0x10) / 2,iVar2 + (local_20 + -0x10) / 2,
                  local_1c,local_20,0,0);
  pFVar4 = (Fl_Adjuster *)Fl::focus();
  if (pFVar4 == this) {
    Fl_Widget::draw_focus((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Adjuster::draw() {
  int dx, dy, W, H;
  if (w()>=h()) {
    dx = W = w()/3;
    dy = 0; H = h();
  } else {
    dx = 0; W = w();
    dy = H = h()/3;
  }
  draw_box(drag==1?FL_DOWN_BOX:box(), x(),  y()+2*dy, W, H, color());
  draw_box(drag==2?FL_DOWN_BOX:box(), x()+dx, y()+dy, W, H, color());
  draw_box(drag==3?FL_DOWN_BOX:box(), x()+2*dx,  y(), W, H, color());
  if (active_r())
    fl_color(selection_color());
  else
    fl_color(fl_inactive(selection_color()));
  fastarrow.draw(x()+(W-fastarrow_width)/2,
		 y()+2*dy+(H-fastarrow_height)/2, W, H);
  mediumarrow.draw(x()+dx+(W-mediumarrow_width)/2,
		   y()+dy+(H-mediumarrow_height)/2, W, H);
  slowarrow.draw(x()+2*dx+(W-slowarrow_width)/2,
		 y()+(H-slowarrow_width)/2, W, H);
  if (Fl::focus() == this) draw_focus();
}